

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O3

void __thiscall
btDbvtBroadphase::destroyProxy
          (btDbvtBroadphase *this,btBroadphaseProxy *absproxy,btDispatcher *dispatcher)

{
  btDbvtProxy *pbVar1;
  btDbvtProxy **ppbVar2;
  btDbvt *this_00;
  
  this_00 = (btDbvt *)&this->field_0x8;
  if (absproxy[1].m_uniqueId == 2) {
    this_00 = (btDbvt *)&this->field_0x68;
  }
  btDbvt::remove(this_00,(char *)absproxy[1].m_clientObject);
  pbVar1 = (btDbvtProxy *)absproxy[1].m_multiSapParentProxy;
  ppbVar2 = (btDbvtProxy **)(*(long *)&absproxy[1].m_collisionFilterGroup + 0x50);
  if (*(long *)&absproxy[1].m_collisionFilterGroup == 0) {
    ppbVar2 = this->m_stageRoots + absproxy[1].m_uniqueId;
  }
  *ppbVar2 = pbVar1;
  if (pbVar1 != (btDbvtProxy *)0x0) {
    pbVar1->links[0] = *(btDbvtProxy **)&absproxy[1].m_collisionFilterGroup;
  }
  (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[4])
            (this->m_paircache,absproxy,dispatcher);
  btAlignedFreeInternal(absproxy);
  this->m_needcleanup = true;
  return;
}

Assistant:

void							btDbvtBroadphase::destroyProxy(	btBroadphaseProxy* absproxy,
															   btDispatcher* dispatcher)
{
	btDbvtProxy*	proxy=(btDbvtProxy*)absproxy;
	if(proxy->stage==STAGECOUNT)
		m_sets[1].remove(proxy->leaf);
	else
		m_sets[0].remove(proxy->leaf);
	listremove(proxy,m_stageRoots[proxy->stage]);
	m_paircache->removeOverlappingPairsContainingProxy(proxy,dispatcher);
	btAlignedFree(proxy);
	m_needcleanup=true;
}